

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

size_t google::protobuf::internal::VarintSize<true,false,int>(int *data,int n)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar2 = n & 0xffffffe0;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
    uVar5 = uVar2;
  }
  else {
    iVar6 = 0;
    iVar7 = 0;
    iVar8 = 0;
    uVar4 = 0;
    uVar5 = uVar2;
    do {
      piVar1 = data + uVar4;
      uVar3 = *piVar1 >> 0x1f ^ *piVar1 * 2 ^ 0x80000000;
      uVar9 = piVar1[1] >> 0x1f ^ piVar1[1] * 2 ^ 0x80000000;
      uVar10 = piVar1[2] >> 0x1f ^ piVar1[2] * 2 ^ 0x80000000;
      uVar11 = piVar1[3] >> 0x1f ^ piVar1[3] * 2 ^ 0x80000000;
      uVar5 = uVar5 + (-0x7fffff81 < (int)uVar3) + (uint)(-0x7fffc001 < (int)uVar3) +
              (uint)(-0x7fe00001 < (int)uVar3) + (uint)(-0x70000001 < (int)uVar3);
      iVar6 = iVar6 + (uint)(-0x7fffff81 < (int)uVar9) + (uint)(-0x7fffc001 < (int)uVar9) +
              (uint)(-0x7fe00001 < (int)uVar9) + (uint)(-0x70000001 < (int)uVar9);
      iVar7 = iVar7 + (uint)(-0x7fffff81 < (int)uVar10) + (uint)(-0x7fffc001 < (int)uVar10) +
              (uint)(-0x7fe00001 < (int)uVar10) + (uint)(-0x70000001 < (int)uVar10);
      iVar8 = iVar8 + (uint)(-0x7fffff81 < (int)uVar11) + (uint)(-0x7fffc001 < (int)uVar11) +
              (uint)(-0x7fe00001 < (int)uVar11) + (uint)(-0x70000001 < (int)uVar11);
      uVar4 = uVar4 + 4;
    } while (uVar2 != uVar4);
    uVar5 = iVar8 + iVar6 + iVar7 + uVar5;
    uVar3 = uVar2;
  }
  if ((int)uVar3 < n) {
    uVar4 = (ulong)uVar3;
    do {
      uVar2 = data[uVar4] >> 0x1f ^ data[uVar4] * 2 | 1;
      iVar6 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar5 = uVar5 + (iVar6 * 9 + 0x49U >> 6);
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  return (ulong)uVar5;
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
  // This approach is only faster when vectorized, and the vectorized
  // implementation only works in units of the platform's vector width, and is
  // only faster once a certain number of iterations are used. Normally the
  // compiler generates two loops - one partially unrolled vectorized loop that
  // processes big chunks, and a second "epilogue" scalar loop to finish up the
  // remainder. This is done manually here so that the faster scalar
  // implementation is used for small inputs and for the epilogue.
  int vectorN = n & -32;
  uint32_t sum = vectorN;
  uint32_t msb_sum = 0;
  int i = 0;
  for (; i < vectorN; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SIMD sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
#ifdef __clang__
// Clang is not smart enough to see that this loop doesn't run many times
// NOLINTNEXTLINE(google3-runtime-pragma-loop-hint): b/315043579
#pragma clang loop vectorize(disable) unroll(disable) interleave(disable)
#endif
  for (; i < n; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      sum += WireFormatLite::SInt32Size(x);
    } else if (SignExtended) {
      sum += WireFormatLite::Int32Size(x);
    } else {
      sum += WireFormatLite::UInt32Size(x);
    }
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}